

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicSyntaxSSO::Run(BasicSyntaxSSO *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  GLuint GVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  float data [12];
  allocator<char> local_a9;
  long *local_a8;
  long *local_a0;
  long local_98 [2];
  vec3 local_84;
  char *local_78;
  long *local_70;
  long *local_68;
  undefined8 uStack_60;
  long local_58 [5];
  
  bVar2 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,1,0);
  lVar5 = 0x10;
  if (bVar2) {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
               ,"");
    local_a8 = (long *)0x1b281c7;
    local_a0 = local_68;
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,2,(GLchar **)&local_a8);
    this->m_fsp = GVar4;
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_fsp);
    lVar5 = -1;
    if (bVar2) {
      glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_pipeline);
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,2,this->m_fsp);
      local_58[2] = 0x40400000bf800000;
      local_58[3] = 0x3f80000000000000;
      local_58[0] = -0x407fffffbfc00000;
      local_58[1] = 0x3f80000000000000;
      local_68 = (long *)0xbf800000bf800000;
      uStack_60 = 0x3f80000000000000;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
      uVar7 = 0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x30,&local_68,0x88e4);
      glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      bVar2 = true;
      piVar6 = &DAT_01b4f728;
      do {
        iVar1 = *piVar6;
        if (this->m_vsp != 0) {
          glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,(char *)((long)&DAT_01b4f728 + (long)iVar1),&local_a9);
        local_78 = "#version 310 es\nprecision highp float;\nprecision highp int;";
        local_70 = local_a8;
        GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,2,&local_78);
        this->m_vsp = GVar4;
        if (local_a8 != local_98) {
          operator_delete(local_a8,local_98[0] + 1);
        }
        bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                          (&this->super_ShaderStorageBufferObjectBase,this->m_vsp);
        if (!bVar3) break;
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,1,this->m_vsp);
        glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
        local_84.m_data[0] = 0.0;
        local_84.m_data[1] = 1.0;
        local_84.m_data[2] = 0.0;
        bVar3 = ShaderStorageBufferObjectBase::CheckFB
                          (&this->super_ShaderStorageBufferObjectBase,&local_84);
        if (!bVar3) break;
        bVar2 = uVar7 < 7;
        uVar7 = uVar7 + 1;
        piVar6 = piVar6 + 1;
      } while (uVar7 != 8);
      lVar5 = -(ulong)bVar2;
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(1, 0))
			return NOT_SUPPORTED;
		const int		  kCount		  = 8;
		const char* const glsl_vs[kCount] = {
			NL "layout(std430) buffer Buffer {" NL "  vec4 position[3];" NL "} g_input_buffer;" NL "void main() {" NL
			   "  gl_Position = g_input_buffer.position[gl_VertexID];" NL "}",
			NL "coherent buffer Buffer {" NL "  vec4 position0;" NL "  coherent vec4 position1;" NL
			   "  restrict readonly vec4 position2;" NL "} g_input_buffer;" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_input_buffer.position0;" NL
			   "  if (gl_VertexID == 1) gl_Position = g_input_buffer.position1;" NL
			   "  if (gl_VertexID == 2) gl_Position = g_input_buffer.position2;" NL "}",
			NL "layout(std140, binding = 0) readonly buffer Buffer {" NL "  readonly vec4 position[];" NL "};" NL
			   "void main() {" NL "  gl_Position = position[gl_VertexID];" NL "}",
			NL "layout(std430, column_major, std140, std430, row_major, packed, shared) buffer;" NL
			   "layout(std430) buffer;" NL "coherent restrict volatile buffer Buffer {" NL
			   "  restrict coherent vec4 position[];" NL "} g_buffer;" NL "void main() {" NL
			   "  gl_Position = g_buffer.position[gl_VertexID];" NL "}",
			NL "buffer Buffer {" NL "  vec4 position[3];" //
			NL "} g_buffer[1];" NL "void main() {" NL "  gl_Position = g_buffer[0].position[gl_VertexID];" NL "}",
			NL "layout(shared) coherent buffer Buffer {" NL "  restrict volatile vec4 position0;" NL
			   "  readonly vec4 position1;" NL "  vec4 position2;" NL "} g_buffer[1];" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_buffer[0].position0;" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer[0].position1;" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer[0].position2;" NL "}",
			NL "layout(packed) coherent buffer Buffer {" NL "  vec4 position01[2];" NL "  vec4 position2;" NL
			   "} g_buffer;" NL "void main() {" NL "  if (gl_VertexID == 0) gl_Position = g_buffer.position01[0];" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer.position01[1];" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer.position2;" NL "}",
			NL "layout(std430) coherent buffer Buffer {" NL "  coherent vec4 position01[2];" NL "  vec4 position2[];" NL
			   "} g_buffer;" NL "void main() {" NL "  switch (gl_VertexID) {" NL
			   "    case 0: gl_Position = g_buffer.position01[0]; break;" NL
			   "    case 1: gl_Position = g_buffer.position01[1]; break;" NL
			   "    case 2: gl_Position = g_buffer.position2[gl_VertexID - 2]; break;" NL "  }" NL "}",
		};

		const char* const glsl_fs = NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
									   "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);
		if (!CheckProgram(m_fsp))
			return ERROR;

		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		const float data[12] = { -1.0f, -1.0f, 0.0f, 1.0f, 3.0f, -1.0f, 0.0f, 1.0f, -1.0f, 3.0f, 0.0f, 1.0f };
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		glBindProgramPipeline(m_pipeline);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);

		for (int i = 0; i < kCount; ++i)
		{
			if (!RunIteration(glsl_vs[i]))
				return ERROR;
		}

		return NO_ERROR;
	}